

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::logFlushOrFinishAfterEnqueueEnd
          (CLIntercept *this,char *flushOrFinish,char *functionName,cl_int errorCode)

{
  ostream *poVar1;
  double __x;
  ostringstream ss;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"... ");
  poVar1 = std::operator<<(poVar1,flushOrFinish);
  poVar1 = std::operator<<(poVar1," after ");
  poVar1 = std::operator<<(poVar1,functionName);
  poVar1 = std::operator<<(poVar1," returned ");
  CEnumNameMap::name_abi_cxx11_(&local_1c0,&this->m_EnumNameMap,errorCode);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,errorCode);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::mutex::lock(&this->m_Mutex);
  __x = (double)std::__cxx11::stringbuf::str();
  log(this,__x);
  std::__cxx11::string::~string((string *)&local_1c0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void CLIntercept::logFlushOrFinishAfterEnqueueEnd(
    const char* flushOrFinish,
    const char* functionName,
    cl_int errorCode )
{
    std::ostringstream  ss;
    ss << "... " << flushOrFinish << " after " << functionName << " returned " << enumName().name( errorCode ) << " (" << errorCode << ")\n";

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( ss.str() );
}